

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AuthReadCol(Parse *pParse,char *zTab,char *zCol,int iDb)

{
  sqlite3 *psVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  
  psVar1 = pParse->db;
  uVar3 = 0;
  if ((psVar1->init).busy == '\0') {
    pcVar2 = psVar1->aDb[iDb].zDbSName;
    uVar3 = (*psVar1->xAuth)(psVar1->pAuthArg,0x14,zTab,zCol,pcVar2,pParse->zAuthContext);
    if (uVar3 == 1) {
      if ((iDb == 0) && (psVar1->nDb < 3)) {
        sqlite3ErrorMsg(pParse,"access to %s.%s is prohibited",zTab,zCol);
      }
      else {
        sqlite3ErrorMsg(pParse,"access to %s.%s.%s is prohibited",pcVar2,zTab,zCol);
      }
      uVar3 = 1;
      iVar4 = 0x17;
    }
    else {
      if ((uVar3 & 0xfffffffd) == 0) {
        return uVar3;
      }
      sqlite3ErrorMsg(pParse,"authorizer malfunction");
      iVar4 = 1;
    }
    pParse->rc = iVar4;
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3AuthReadCol(
  Parse *pParse,                  /* The parser context */
  const char *zTab,               /* Table name */
  const char *zCol,               /* Column name */
  int iDb                         /* Index of containing database. */
){
  sqlite3 *db = pParse->db;          /* Database handle */
  char *zDb = db->aDb[iDb].zDbSName; /* Schema name of attached database */
  int rc;                            /* Auth callback return code */

  if( db->init.busy ) return SQLITE_OK;
  rc = db->xAuth(db->pAuthArg, SQLITE_READ, zTab,zCol,zDb,pParse->zAuthContext
#ifdef SQLITE_USER_AUTHENTICATION
                 ,db->auth.zAuthUser
#endif
                );
  if( rc==SQLITE_DENY ){
    if( db->nDb>2 || iDb!=0 ){
      sqlite3ErrorMsg(pParse, "access to %s.%s.%s is prohibited",zDb,zTab,zCol);
    }else{
      sqlite3ErrorMsg(pParse, "access to %s.%s is prohibited", zTab, zCol);
    }
    pParse->rc = SQLITE_AUTH;
  }else if( rc!=SQLITE_IGNORE && rc!=SQLITE_OK ){
    sqliteAuthBadReturnCode(pParse);
  }
  return rc;
}